

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_attach(ATTACH_HANDLE attach)

{
  ATTACH_INSTANCE *attach_instance;
  AMQP_VALUE result;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance = (ATTACH_INSTANCE *)0x0;
  }
  else {
    attach_instance = (ATTACH_INSTANCE *)amqpvalue_clone(attach->composite_value);
  }
  return (AMQP_VALUE)attach_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_attach(ATTACH_HANDLE attach)
{
    AMQP_VALUE result;

    if (attach == NULL)
    {
        result = NULL;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        result = amqpvalue_clone(attach_instance->composite_value);
    }

    return result;
}